

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *
pstore::dump::string::write_unquoted<std::wostream>
          (basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *os,string *v)

{
  char cVar1;
  size_type sVar2;
  pointer pcVar3;
  long *plVar4;
  undefined4 uVar5;
  undefined8 in_RAX;
  size_type sVar6;
  undefined8 local_38;
  
  local_38 = in_RAX;
  if ((v->_M_string_length != 0) && ((byte)(*(v->_M_dataplus)._M_p - 0x21U) < 2)) {
    std::operator<<(os,"\\");
  }
  sVar2 = v->_M_string_length;
  if (sVar2 != 0) {
    pcVar3 = (v->_M_dataplus)._M_p;
    sVar6 = 0;
    do {
      cVar1 = pcVar3[sVar6];
      if (cVar1 == '\\') {
        plVar4 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
        if (plVar4 == (long *)0x0) goto LAB_0011b5d2;
        uVar5 = (**(code **)(*plVar4 + 0x50))(plVar4,0x5c);
        local_38 = CONCAT44(local_38._4_4_,uVar5);
        std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,(wchar_t *)&local_38,1);
      }
      plVar4 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
      if (plVar4 == (long *)0x0) {
LAB_0011b5d2:
        std::__throw_bad_cast();
      }
      uVar5 = (**(code **)(*plVar4 + 0x50))(plVar4,(int)cVar1);
      local_38 = CONCAT44(uVar5,(wchar_t)local_38);
      std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                (os,(wchar_t *)((long)&local_38 + 4),1);
      sVar6 = sVar6 + 1;
    } while (sVar2 != sVar6);
  }
  return os;
}

Assistant:

OStream & string::write_unquoted (OStream & os, std::string const & v) {
            // If the string starts with backslash or bang, prefix with a backslash
            if (v.length () > 0) {
                auto const front = v.front ();
                if (front == '\"' || front == '!') {
                    os << "\\";
                }
            }
            // Emit the characters; a backslash is escaped.
            for (char ch : v) {
                if (ch == '\\') {
                    os << '\\';
                }
                os << ch;
            }
            return os;
        }